

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

int __thiscall CTcPrsOpBinGroup::find_and_apply_op(CTcPrsOpBinGroup *this,CTcPrsNode **lhs)

{
  int iVar1;
  int iVar2;
  CTcPrsOpBin *pCVar3;
  undefined4 extraout_var;
  CTcPrsNode *pCVar5;
  undefined4 extraout_var_01;
  CTcPrsOpBin **ppCVar6;
  long lVar4;
  undefined4 extraout_var_00;
  
  ppCVar6 = this->ops_;
  pCVar3 = *ppCVar6;
  if (pCVar3 != (CTcPrsOpBin *)0x0) {
    do {
      if ((G_tok->curtok_).typ_ == pCVar3->op_tok_) {
        CTcTokenizer::next(G_tok);
        iVar1 = (**this->right_->_vptr_CTcPrsOp)();
        lVar4 = CONCAT44(extraout_var,iVar1);
        if (lVar4 == 0) {
          pCVar5 = (CTcPrsNode *)0x0;
          iVar1 = 0;
        }
        else {
          iVar1 = (*((*ppCVar6)->super_CTcPrsOp)._vptr_CTcPrsOp[2])(*ppCVar6,*lhs,lVar4);
          pCVar5 = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar1);
          iVar1 = 1;
          if (pCVar5 == (CTcPrsNode *)0x0) {
            iVar2 = (*((*ppCVar6)->super_CTcPrsOp)._vptr_CTcPrsOp[1])(*ppCVar6,*lhs,lVar4);
            pCVar5 = (CTcPrsNode *)CONCAT44(extraout_var_01,iVar2);
          }
        }
        *lhs = pCVar5;
        return iVar1;
      }
      pCVar3 = ppCVar6[1];
      ppCVar6 = ppCVar6 + 1;
    } while (pCVar3 != (CTcPrsOpBin *)0x0);
  }
  return 0;
}

Assistant:

int CTcPrsOpBinGroup::find_and_apply_op(CTcPrsNode **lhs) const
{
    /* check each operator at this precedence level */
    for (const CTcPrsOpBin *const *op = ops_ ; *op != 0 ; ++op)
    {
        /* check this operator's token */
        if (G_tok->cur() == (*op)->get_op_tok())
        {
            /* skip the operator token */
            G_tok->next();

            /* parse the right-hand side */
            CTcPrsNode *rhs = right_->parse();
            if (rhs == 0)
            {
                /* error - cancel the entire expression */
                *lhs = 0;
                return FALSE;
            }

            /* try folding our subnodes into a constant value */
            CTcPrsNode *const_tree = (*op)->eval_constant(*lhs, rhs);

            /* 
             *   if we couldn't calculate a constant value, build the tree
             *   normally 
             */
            if (const_tree == 0)
            {
                /* 
                 *   build my tree, replacing the original left-hand side
                 *   with the new expression 
                 */
                *lhs = (*op)->build_tree(*lhs, rhs);
            }
            else
            {
                /* we got a constant value - use it as the result */
                *lhs = const_tree;
            }

            /*
             *   Tell the caller to proceed to parse any additional
             *   occurrences of our operator - this will apply the next
             *   occurrence of the operator as the left-hand side of the
             *   new operator.  
             */
            return TRUE;
        }
    }

    /* 
     *   if we got here, we didn't find an operator - tell the caller that
     *   we've reached the end of this operator's possible span
     */
    return FALSE;
}